

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateBuilderParsingCode
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  MessageLite *pMVar2;
  char *pcVar3;
  size_t sVar4;
  string_view text;
  
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                     (&(pFVar1->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__00832a20);
  if ((((int)pMVar2[1]._internal_metadata_.ptr_ == 2) ||
      ((pFVar1->merged_features_->field_0)._impl_.utf8_validation_ == 2)) ||
     ((pFVar1->file_->options_->field_0)._impl_.java_string_check_utf8_ == true)) {
    pcVar3 = 
    "java.lang.String s = input.readStringRequireUtf8();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n"
    ;
    sVar4 = 0x61;
  }
  else {
    pcVar3 = 
    "com.google.protobuf.ByteString bs = input.readBytes();\n$set_oneof_case_message$;\n$oneof_name$_ = bs;\n"
    ;
    sVar4 = 0x65;
  }
  text._M_str = pcVar3;
  text._M_len = sVar4;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_ImmutableStringFieldGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableStringOneofFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
                   "java.lang.String s = input.readStringRequireUtf8();\n"
                   "$set_oneof_case_message$;\n"
                   "$oneof_name$_ = s;\n");
  } else {
    printer->Print(variables_,
                   "com.google.protobuf.ByteString bs = input.readBytes();\n"
                   "$set_oneof_case_message$;\n"
                   "$oneof_name$_ = bs;\n");
  }
}